

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

int glfwJoystickIsGamepad(int jid)

{
  ulong uVar1;
  GLFWbool GVar2;
  int iVar3;
  uint uVar4;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/input.c",
                  0x4d5,"int glfwJoystickIsGamepad(int)");
  }
  uVar1 = (ulong)(uint)jid;
  if ((uint)jid < 0x10) {
    if (_glfw.initialized == 0) {
      uVar4 = 0;
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      GVar2 = initJoysticks();
      uVar4 = 0;
      if ((GVar2 != 0) && (_glfw.joysticks[uVar1].present != 0)) {
        uVar4 = 0;
        iVar3 = (*_glfw.platform.pollJoystick)((_GLFWjoystick *)(uVar1 * 0x2018 + 0x14cd78),0);
        if (iVar3 != 0) {
          uVar4 = (uint)(_glfw.joysticks[uVar1].mapping != (_GLFWmapping *)0x0);
        }
      }
    }
    return uVar4;
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/input.c",
                0x4d6,"int glfwJoystickIsGamepad(int)");
}

Assistant:

GLFWAPI int glfwJoystickIsGamepad(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return GLFW_FALSE;
    }

    if (!initJoysticks())
        return GLFW_FALSE;

    js = _glfw.joysticks + jid;
    if (!js->present)
        return GLFW_FALSE;

    if (!_glfw.platform.pollJoystick(js, _GLFW_POLL_PRESENCE))
        return GLFW_FALSE;

    return js->mapping != NULL;
}